

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InterpolateAtOffsetCase::
genFragmentSource_abi_cxx11_(string *__return_storage_ptr__,void *this,int numTargetSamples)

{
  char *pcVar1;
  ostream *poVar2;
  RenderContext *pRVar3;
  char *local_208;
  ContextType local_1dc;
  string local_1d8;
  char *local_1b8;
  char *qualifier;
  ostringstream local_1a0 [8];
  ostringstream buf;
  char *arrayIndexing;
  int numTargetSamples_local;
  InterpolateAtOffsetCase *this_local;
  
  pcVar1 = "";
  if (*(int *)((long)this + 0x128) == 3) {
    pcVar1 = "[1]";
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::operator<<((ostream *)local_1a0,
                  "${GLSL_VERSION_DECL}\n${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}");
  if (((*(int *)((long)this + 0x128) == 0) || (*(int *)((long)this + 0x128) == 1)) ||
     (*(int *)((long)this + 0x128) == 2)) {
    if (*(int *)((long)this + 0x128) == 1) {
      local_208 = "centroid ";
    }
    else {
      local_208 = "";
      if (*(int *)((long)this + 0x128) == 2) {
        local_208 = "sample ";
      }
    }
    local_1b8 = local_208;
    poVar2 = std::operator<<((ostream *)local_1a0,local_208);
    poVar2 = std::operator<<(poVar2,"in highp vec2 v_screenPosition;\n");
    poVar2 = std::operator<<(poVar2,local_1b8);
    std::operator<<(poVar2,"in highp vec2 v_offset;\n");
  }
  else if (*(int *)((long)this + 0x128) == 3) {
    poVar2 = std::operator<<((ostream *)local_1a0,"in highp vec2[2] v_screenPosition;\n");
    std::operator<<(poVar2,"in highp vec2 v_offset;\n");
  }
  poVar2 = std::operator<<((ostream *)local_1a0,
                           "layout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tconst highp float threshold = 0.15625; // 4 subpixel bits. Assume 3 accurate bits + 0.03125 for other errors\n\n\thighp vec2 pixelCenter = floor(v_screenPosition"
                          );
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2,
                           ") + vec2(0.5, 0.5);\n\thighp vec2 offsetValue = interpolateAtOffset(v_screenPosition"
                          );
  poVar2 = std::operator<<(poVar2,pcVar1);
  std::operator<<(poVar2,
                  ", v_offset);\n\thighp vec2 refValue = pixelCenter + v_offset;\n\n\tbool valuesEqual = all(lessThan(abs(offsetValue - refValue), vec2(threshold)));\n\tif (valuesEqual)\n\t\tfragColor = vec4(0.0, 1.0, 0.0, 1.0);\n\telse\n\t\tfragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
                 );
  std::__cxx11::ostringstream::str();
  pRVar3 = Context::getRenderContext(*(Context **)((long)this + 0x70));
  local_1dc.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  anon_unknown_2::specializeShader(__return_storage_ptr__,&local_1d8,&local_1dc);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string InterpolateAtOffsetCase::genFragmentSource (int numTargetSamples) const
{
	DE_UNREF(numTargetSamples);

	const char* const	arrayIndexing = (m_testType == TEST_ARRAY_ELEMENT) ? ("[1]") : ("");
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}";

	if (m_testType == TEST_QUALIFIER_NONE || m_testType == TEST_QUALIFIER_CENTROID || m_testType == TEST_QUALIFIER_SAMPLE)
	{
		const char* const qualifier = (m_testType == TEST_QUALIFIER_CENTROID) ? ("centroid ") : (m_testType == TEST_QUALIFIER_SAMPLE) ? ("sample ") : ("");
		buf	<< qualifier << "in highp vec2 v_screenPosition;\n"
			<< qualifier << "in highp vec2 v_offset;\n";
	}
	else if (m_testType == TEST_ARRAY_ELEMENT)
	{
		buf << "in highp vec2[2] v_screenPosition;\n"
			<< "in highp vec2 v_offset;\n";
	}
	else
		DE_ASSERT(false);

	buf	<<	"layout(location = 0) out mediump vec4 fragColor;\n"
			"void main (void)\n"
			"{\n"
			"	const highp float threshold = 0.15625; // 4 subpixel bits. Assume 3 accurate bits + 0.03125 for other errors\n" // 0.03125 = mediump epsilon when value = 32 (RENDER_SIZE)
			"\n"
			"	highp vec2 pixelCenter = floor(v_screenPosition" << arrayIndexing << ") + vec2(0.5, 0.5);\n"
			"	highp vec2 offsetValue = interpolateAtOffset(v_screenPosition" << arrayIndexing << ", v_offset);\n"
			"	highp vec2 refValue = pixelCenter + v_offset;\n"
			"\n"
			"	bool valuesEqual = all(lessThan(abs(offsetValue - refValue), vec2(threshold)));\n"
			"	if (valuesEqual)\n"
			"		fragColor = vec4(0.0, 1.0, 0.0, 1.0);\n"
			"	else\n"
			"		fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
			"}\n";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}